

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.h
# Opt level: O1

void __thiscall FxConstant::FxConstant(FxConstant *this,PClass *val,FScriptPosition *pos)

{
  PClassPointer *pPVar1;
  
  FxExpression::FxExpression(&this->super_FxExpression,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_008682d0;
  (this->value).Type = (PType *)TypeSInt32;
  (this->value).field_1.pointer = val;
  (this->super_FxExpression).ValueType = (PType *)val;
  pPVar1 = NewClassPointer(AActor::RegistrationInfo.MyClass);
  (this->value).Type = (PType *)pPVar1;
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(PClass *val, const FScriptPosition &pos) : FxExpression(pos)
	{
		value.pointer = (void*)val;
		ValueType = val;
		value.Type = NewClassPointer(RUNTIME_CLASS(AActor));
		isresolved = true;
	}